

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states,
                       xmlRelaxNGValidStatePtr state)

{
  xmlRelaxNGValidStatePtr pxVar1;
  int iVar2;
  xmlRelaxNGValidStatePtr *ppxVar3;
  long lVar4;
  long lVar5;
  
  iVar2 = -1;
  if (states != (xmlRelaxNGStatesPtr)0x0 && state != (xmlRelaxNGValidStatePtr)0x0) {
    iVar2 = states->maxState;
    if (iVar2 <= states->nbState) {
      ppxVar3 = (xmlRelaxNGValidStatePtr *)(*xmlRealloc)(states->tabState,(long)iVar2 << 4);
      if (ppxVar3 == (xmlRelaxNGValidStatePtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return -1;
      }
      states->tabState = ppxVar3;
      states->maxState = iVar2 * 2;
    }
    iVar2 = states->nbState;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        pxVar1 = states->tabState[lVar5];
        if (pxVar1 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar1 == state) {
LAB_0018bed2:
            xmlRelaxNGFreeValidState(ctxt,state);
            return 0;
          }
          if ((((state->node == pxVar1->node) && (state->seq == pxVar1->seq)) &&
              (state->nbAttrLeft == pxVar1->nbAttrLeft)) &&
             ((state->nbAttrs == pxVar1->nbAttrs && (state->endvalue == pxVar1->endvalue)))) {
            if ((state->value == pxVar1->value) ||
               (iVar2 = xmlStrEqual(state->value,pxVar1->value), iVar2 != 0)) {
              if ((long)state->nbAttrs < 1) goto LAB_0018bed2;
              lVar4 = 0;
              while (state->attrs[lVar4] == pxVar1->attrs[lVar4]) {
                lVar4 = lVar4 + 1;
                if (state->nbAttrs == lVar4) goto LAB_0018bed2;
              }
            }
          }
        }
        lVar5 = lVar5 + 1;
        iVar2 = states->nbState;
      } while (lVar5 < iVar2);
    }
    states->nbState = iVar2 + 1;
    states->tabState[iVar2] = state;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,
                    xmlRelaxNGStatesPtr states,
                    xmlRelaxNGValidStatePtr state)
{
    int i;

    if (state == NULL || states == NULL) {
        return (-1);
    }
    if (states->nbState >= states->maxState) {
        xmlRelaxNGValidStatePtr *tmp;
        int size;

        size = states->maxState * 2;
        tmp = (xmlRelaxNGValidStatePtr *) xmlRealloc(states->tabState,
                                                     (size) *
                                                     sizeof
                                                     (xmlRelaxNGValidStatePtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
        states->tabState = tmp;
        states->maxState = size;
    }
    for (i = 0; i < states->nbState; i++) {
        if (xmlRelaxNGEqualValidState(ctxt, state, states->tabState[i])) {
            xmlRelaxNGFreeValidState(ctxt, state);
            return (0);
        }
    }
    states->tabState[states->nbState++] = state;
    return (1);
}